

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O2

void __thiscall
cppnet::Dispatcher::Listen::anon_class_56_4_e8c7a8e2::operator()(anon_class_56_4_e8c7a8e2 *this)

{
  Dispatcher *pDVar1;
  shared_ptr<cppnet::ConnectSocket> connect_sock;
  long *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2> local_48;
  __weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  pDVar1 = this->this;
  MakeConnectSocket();
  std::__weak_ptr<cppnet::EventActions,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<cppnet::EventActions,void>
            ((__weak_ptr<cppnet::EventActions,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             &(pDVar1->_event_actions).
              super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>);
  std::__weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2> *)(local_68 + 10),
             &local_38);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_38._M_refcount);
  std::__shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,&pDVar1->_cppnet_base);
  std::__weak_ptr<cppnet::CppNetBase,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_ptr<cppnet::CppNetBase,(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8),&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  local_68[1] = this->sock;
  std::__shared_ptr<cppnet::Dispatcher,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppnet::Dispatcher,void>
            ((__shared_ptr<cppnet::Dispatcher,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (__weak_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2> *)
             &pDVar1->super_enable_shared_from_this<cppnet::Dispatcher>);
  std::__weak_ptr<cppnet::Dispatcher,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_ptr<cppnet::Dispatcher,(__gnu_cxx::_Lock_policy)2> *)(local_68 + 0xc),&local_58
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  (**(code **)(*local_68 + 0x10))(local_68,&this->ip,this->port);
  (**(code **)(*local_68 + 0x18))();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  return;
}

Assistant:

void Dispatcher::Listen(uint64_t sock, const std::string& ip, uint16_t port) {
    auto task = [sock, ip, port, this]() {
        auto connect_sock = MakeConnectSocket();
        connect_sock->SetEventActions(_event_actions);
        connect_sock->SetCppNetBase(_cppnet_base.lock());
        connect_sock->SetSocket(sock);
        connect_sock->SetDispatcher(shared_from_this());

        connect_sock->Bind(ip, port);
        connect_sock->Listen();
    };

    if (std::this_thread::get_id() == _local_thread_id) {
        task();

    } else {
        PostTask(task);
    }
}